

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::adjustDocumentChangesAndCursors
          (QTextDocumentPrivate *this,int from,int addedOrRemoved,Operation op)

{
  int iVar1;
  QTextCursorPrivate *this_00;
  bool bVar2;
  AdjustResult AVar3;
  int iVar4;
  QTextCursorPrivate **ppQVar5;
  int *piVar6;
  Operation in_ECX;
  int in_EDX;
  int in_ESI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  int removedInside;
  int overlap_end;
  int overlap_start;
  int diff;
  int removed;
  int added;
  QTextCursorPrivate *curs;
  add_const_t<QSet<QTextCursorPrivate_*>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator *in_stack_ffffffffffffff68;
  int local_7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar7;
  int local_4c [3];
  int local_40;
  int local_3c [3];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((long)&in_RDI[0xc].i.i.bucket + 4) == 0) {
    *(int *)&in_RDI[0xc].i.i.d = *(int *)&in_RDI[0xc].i.i.d + 1;
  }
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((*(byte *)((long)&in_RDI[0x29].i.i.d + 4) >> 1 & 1) == 0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QTextCursorPrivate_*>::begin
              ((QSet<QTextCursorPrivate_*> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QTextCursorPrivate_*>::end
              ((QSet<QTextCursorPrivate_*> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while (bVar2 = QSet<QTextCursorPrivate_*>::const_iterator::operator!=
                             (in_RDI,in_stack_ffffffffffffff68), bVar2) {
      ppQVar5 = QSet<QTextCursorPrivate_*>::const_iterator::operator*((const_iterator *)0x7d1bd5);
      this_00 = *ppQVar5;
      AVar3 = QTextCursorPrivate::adjustPosition(this_00,local_c,local_10,in_ECX);
      if (AVar3 == CursorMoved) {
        this_00->field_0x28 = this_00->field_0x28 & 0xfb | 4;
      }
      QSet<QTextCursorPrivate_*>::const_iterator::operator++(in_RDI);
    }
  }
  if (*(int *)((long)&in_RDI[0xd].i.i.d + 4) < 0) {
    *(int *)((long)&in_RDI[0xd].i.i.d + 4) = local_c;
    if (local_10 < 1) {
      *(int *)&in_RDI[0xd].i.i.bucket = -local_10;
      *(undefined4 *)((long)&in_RDI[0xd].i.i.bucket + 4) = 0;
    }
    else {
      *(undefined4 *)&in_RDI[0xd].i.i.bucket = 0;
      *(int *)((long)&in_RDI[0xd].i.i.bucket + 4) = local_10;
    }
  }
  else {
    local_3c[2] = 0;
    piVar6 = qMax<int>(local_3c + 2,&local_10);
    iVar7 = *piVar6;
    local_3c[1] = 0;
    local_3c[0] = -local_10;
    piVar6 = qMax<int>(local_3c + 1,local_3c);
    iVar4 = *piVar6;
    local_7c = 0;
    if (local_c + iVar4 < *(int *)((long)&in_RDI[0xd].i.i.d + 4)) {
      local_7c = (*(int *)((long)&in_RDI[0xd].i.i.d + 4) - local_c) - iVar4;
    }
    else if (*(int *)((long)&in_RDI[0xd].i.i.d + 4) + *(int *)((long)&in_RDI[0xd].i.i.bucket + 4) <
             local_c) {
      local_7c = local_c - (*(int *)((long)&in_RDI[0xd].i.i.d + 4) +
                           *(int *)((long)&in_RDI[0xd].i.i.bucket + 4));
    }
    piVar6 = qMax<int>(&local_c,(int *)((long)&in_RDI[0xd].i.i.d + 4));
    iVar1 = *piVar6;
    local_40 = local_c + iVar4;
    local_4c[2] = *(int *)((long)&in_RDI[0xd].i.i.d + 4) +
                  *(int *)((long)&in_RDI[0xd].i.i.bucket + 4);
    piVar6 = qMin<int>(&local_40,local_4c + 2);
    local_4c[1] = 0;
    local_4c[0] = *piVar6 - iVar1;
    piVar6 = qMax<int>(local_4c + 1,local_4c);
    iVar1 = *piVar6;
    iVar4 = iVar4 - iVar1;
    piVar6 = qMin<int>((int *)((long)&in_RDI[0xd].i.i.d + 4),&local_c);
    *(int *)((long)&in_RDI[0xd].i.i.d + 4) = *piVar6;
    *(int *)&in_RDI[0xd].i.i.bucket = iVar4 + local_7c + (int)in_RDI[0xd].i.i.bucket;
    *(int *)((long)&in_RDI[0xd].i.i.bucket + 4) =
         (iVar7 - iVar1) + local_7c + *(int *)((long)&in_RDI[0xd].i.i.bucket + 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::adjustDocumentChangesAndCursors(int from, int addedOrRemoved, QTextUndoCommand::Operation op)
{
    if (!editBlock)
        ++revision;

    if (blockCursorAdjustment)  {
        ; // postpone, will be called again from QTextDocumentPrivate::remove()
    } else {
        for (QTextCursorPrivate *curs : std::as_const(cursors)) {
            if (curs->adjustPosition(from, addedOrRemoved, op) == QTextCursorPrivate::CursorMoved) {
                curs->changed = true;
            }
        }
    }

//     qDebug("QTextDocumentPrivate::adjustDocumentChanges: from=%d,addedOrRemoved=%d", from, addedOrRemoved);
    if (docChangeFrom < 0) {
        docChangeFrom = from;
        if (addedOrRemoved > 0) {
            docChangeOldLength = 0;
            docChangeLength = addedOrRemoved;
        } else {
            docChangeOldLength = -addedOrRemoved;
            docChangeLength = 0;
        }
//         qDebug("adjustDocumentChanges:");
//         qDebug("    -> %d %d %d", docChangeFrom, docChangeOldLength, docChangeLength);
        return;
    }

    // have to merge the new change with the already existing one.
    int added = qMax(0, addedOrRemoved);
    int removed = qMax(0, -addedOrRemoved);

    int diff = 0;
    if (from + removed < docChangeFrom)
        diff = docChangeFrom - from - removed;
    else if (from > docChangeFrom + docChangeLength)
        diff = from - (docChangeFrom + docChangeLength);

    int overlap_start = qMax(from, docChangeFrom);
    int overlap_end = qMin(from + removed, docChangeFrom + docChangeLength);
    int removedInside = qMax(0, overlap_end - overlap_start);
    removed -= removedInside;

//     qDebug("adjustDocumentChanges: from=%d, addedOrRemoved=%d, diff=%d, removedInside=%d", from, addedOrRemoved, diff, removedInside);
    docChangeFrom = qMin(docChangeFrom, from);
    docChangeOldLength += removed + diff;
    docChangeLength += added - removedInside + diff;
//     qDebug("    -> %d %d %d", docChangeFrom, docChangeOldLength, docChangeLength);

}